

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

int __thiscall Imf_2_5::OutputFile::currentScanLine(OutputFile *this)

{
  int iVar1;
  Lock local_20;
  
  local_20._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_20._mutex);
  local_20._locked = true;
  iVar1 = this->_data->currentScanLine;
  IlmThread_2_5::Lock::~Lock(&local_20);
  return iVar1;
}

Assistant:

int	
OutputFile::currentScanLine () const
{
    Lock lock (*_data->_streamData);
    return _data->currentScanLine;
}